

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_set_da_iss(DisasContext_conflict1 *s,MemOp memop,ISSInfo issinfo)

{
  if ((issinfo & ISSRegMask) != 0xf && (char)((issinfo & ISSInvalid) >> 5) == '\0') {
    if (s->insn_start == (TCGOp *)0x0) {
      __assert_fail("s->insn_start != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate.h"
                    ,0x8d,"void disas_set_insn_syndrome(DisasContext *, uint32_t)");
    }
    s->insn_start->args[2] =
         (ulong)((uint)((issinfo >> 8 & 1) == 0) * 0x2000000 +
                 ((issinfo & ISSIsAcqRel) << 8 |
                 (issinfo & ISSRegMask) << 0x10 |
                 (memop & MO_64) << 0x16 | (memop & MO_ASHIFT) << 0x13) + 0x1000000 >> 0xe);
    s->insn_start = (TCGOp *)0x0;
  }
  return;
}

Assistant:

static void disas_set_da_iss(DisasContext *s, MemOp memop, ISSInfo issinfo)
{
    uint32_t syn;
    int sas = memop & MO_SIZE;
    bool sse = memop & MO_SIGN;
    bool is_acqrel = issinfo & ISSIsAcqRel;
    bool is_write = issinfo & ISSIsWrite;
    bool is_16bit = issinfo & ISSIs16Bit;
    int srt = issinfo & ISSRegMask;

    if (issinfo & ISSInvalid) {
        /* Some callsites want to conditionally provide ISS info,
         * eg "only if this was not a writeback"
         */
        return;
    }

    if (srt == 15) {
        /* For AArch32, insns where the src/dest is R15 never generate
         * ISS information. Catching that here saves checking at all
         * the call sites.
         */
        return;
    }

    syn = syn_data_abort_with_iss(0, sas, sse, srt, 0, is_acqrel,
                                  0, 0, 0, is_write, 0, is_16bit);
    disas_set_insn_syndrome(s, syn);
}